

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

config_value * parser_parse_value(parser *parser,char *value)

{
  parser_token pVar1;
  char *value_local;
  parser *parser_local;
  
  pVar1 = char_to_token(*value);
  switch(pVar1) {
  case ALPHA_CHAR:
    parser_local = (parser *)parser_parse_boolean(parser,value);
    break;
  case ARRAY_START:
    parser_local = (parser *)parser_parse_array(parser,value);
    break;
  default:
    parser_local = (parser *)0x0;
    break;
  case NUMERIC_CHAR:
    parser_local = (parser *)parser_parse_number(parser,value);
    break;
  case QUOTE:
    parser_local = (parser *)parser_parse_string(parser,value);
    break;
  case VARIABLE_START:
    parser_local = (parser *)parser_parse_variable(parser,value);
  }
  return (config_value *)parser_local;
}

Assistant:

struct config_value *parser_parse_value(struct parser *parser, char *value)
{
        switch (char_to_token(value[0])) {
        case ALPHA_CHAR:
                return parser_parse_boolean(parser, value);
        case ARRAY_START:
                return parser_parse_array(parser, value);
        case NUMERIC_CHAR:
                return parser_parse_number(parser, value);
        case QUOTE:
                return parser_parse_string(parser, value);
        case VARIABLE_START:
                return parser_parse_variable(parser, value);
        default:
                return NULL;
        }
}